

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

int Path::mkdir(char *__path,__mode_t __mode)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  stat s;
  stat local_a0;
  
  iVar1 = ::mkdir(*(char **)__path,0x1e8);
  if (iVar1 == 0) {
    uVar2 = 1;
  }
  else {
    if ((iVar1 < 0) && (piVar3 = __errno_location(), *piVar3 != 0x11)) {
      return 0;
    }
    memset(&local_a0,0,0x90);
    iVar1 = stat(*(char **)__path,&local_a0);
    uVar2 = (uint)((byte)(local_a0.st_mode >> 0xe) & 1 & iVar1 == 0);
  }
  return uVar2;
}

Assistant:

bool mkdir(const std::string &path)
{
#ifdef _WIN32
	if (!CreateDirectoryA(path.c_str(), nullptr))
	{
		if (GetLastError() != ERROR_ALREADY_EXISTS)
			return false;
		if (!is_directory(path))
			return false;
	}
	return true;
#else
	int ret = ::mkdir(path.c_str(), 0750);
	if (ret == 0)
		return true;
	if (ret < 0 && errno != EEXIST)
		return false;

	// Verify the path is actually a directory.
	struct stat s = {};
	return ::stat(path.c_str(), &s) == 0 && (s.st_mode & S_IFDIR) != 0;
#endif
}